

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O2

int ffgics(fitsfile *fptr,double *xrval,double *yrval,double *xrpix,double *yrpix,double *xinc,
          double *yinc,double *rot,char *type,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  int tstat;
  double *local_e0;
  double local_d8;
  double local_d0;
  double cd22;
  double cd11;
  double pc12;
  double pc22;
  double pc21;
  double pc11;
  double cd12;
  double cd21;
  double *local_88;
  double *local_80;
  char ctype [71];
  
  cd11 = 0.0;
  cd21 = 0.0;
  cd22 = 0.0;
  cd12 = 0.0;
  pc21 = 0.0;
  pc12 = 0.0;
  pc11 = 1.0;
  pc22 = 1.0;
  if (0 < *status) {
    return *status;
  }
  tstat = 0;
  local_e0 = xinc;
  iVar1 = ffgkyd(fptr,"CRVAL1",xrval,(char *)0x0,&tstat);
  if (iVar1 != 0) {
    *xrval = 0.0;
  }
  tstat = 0;
  local_80 = xrval;
  iVar1 = ffgkyd(fptr,"CRVAL2",yrval,(char *)0x0,&tstat);
  if (iVar1 != 0) {
    *yrval = 0.0;
  }
  tstat = 0;
  iVar1 = ffgkyd(fptr,"CRPIX1",xrpix,(char *)0x0,&tstat);
  pdVar9 = local_e0;
  if (iVar1 != 0) {
    *xrpix = 0.0;
  }
  tstat = 0;
  iVar1 = ffgkyd(fptr,"CRPIX2",yrpix,(char *)0x0,&tstat);
  if (iVar1 != 0) {
    *yrpix = 0.0;
  }
  tstat = 0;
  iVar1 = ffgkyd(fptr,"CDELT1",pdVar9,(char *)0x0,&tstat);
  if (iVar1 == 0) {
    iVar1 = ffgkyd(fptr,"CDELT2",yinc,(char *)0x0,&tstat);
    if (iVar1 != 0) {
      *yinc = 1.0;
    }
    tstat = 0;
    iVar1 = ffgkyd(fptr,"CROTA2",rot,(char *)0x0,&tstat);
    if (iVar1 == 0) goto LAB_001f2de9;
    *rot = 0.0;
    tstat = 0;
    iVar1 = ffgkyd(fptr,"PC1_1",&pc11,(char *)0x0,&tstat);
    if (iVar1 != 0) {
      tstat = 0;
    }
    iVar2 = ffgkyd(fptr,"PC2_1",&pc21,(char *)0x0,&tstat);
    if (iVar2 != 0) {
      tstat = 0;
    }
    iVar3 = ffgkyd(fptr,"PC1_2",&pc12,(char *)0x0,&tstat);
    if (iVar3 != 0) {
      tstat = 0;
    }
    iVar4 = ffgkyd(fptr,"PC2_2",&pc22,(char *)0x0,&tstat);
    if (iVar4 != 0 && (iVar3 != 0 && (iVar2 != 0 && iVar1 != 0))) goto LAB_001f2de9;
    local_e0 = (double *)atan2(pc21,pc11);
    pdVar8 = (double *)atan2(-pc12,pc22);
    pdVar9 = local_e0;
    if ((double)pdVar8 <= (double)local_e0) {
      pdVar9 = pdVar8;
    }
    pdVar10 = local_e0;
    if ((double)local_e0 <= (double)pdVar8) {
      pdVar10 = pdVar8;
    }
    uVar5 = -(ulong)(1.5707963267948966 < (double)pdVar10 - (double)pdVar9);
    dVar7 = (double)(~uVar5 & (ulong)pdVar9 | (ulong)((double)pdVar9 + 3.141592653589793) & uVar5);
    if (0.0002 < ABS(dVar7 - (double)pdVar10)) {
      *status = 0x1fa;
    }
    dVar7 = (((double)pdVar10 + dVar7) * 0.5 * 180.0) / 3.141592653589793;
  }
  else {
    tstat = 0;
    local_88 = yrval;
    iVar1 = ffgkyd(fptr,"CD1_1",&cd11,(char *)0x0,&tstat);
    if (iVar1 != 0) {
      tstat = 0;
    }
    iVar2 = ffgkyd(fptr,"CD2_1",&cd21,(char *)0x0,&tstat);
    if (iVar2 != 0) {
      tstat = 0;
    }
    iVar3 = ffgkyd(fptr,"CD1_2",&cd12,(char *)0x0,&tstat);
    if (iVar3 != 0) {
      tstat = 0;
    }
    iVar4 = ffgkyd(fptr,"CD2_2",&cd22,(char *)0x0,&tstat);
    yrval = local_88;
    if (iVar4 != 0 && (iVar3 != 0 && (iVar2 != 0 && iVar1 != 0))) {
      *local_e0 = 1.0;
      tstat = 0;
      iVar1 = ffgkyd(fptr,"CDELT2",yinc,(char *)0x0,&tstat);
      if (iVar1 != 0) {
        *yinc = 1.0;
      }
      tstat = 0;
      iVar1 = ffgkyd(fptr,"CROTA2",rot,(char *)0x0,&tstat);
      dVar7 = 0.0;
      if (iVar1 == 0) goto LAB_001f2de9;
    }
    else {
      local_d8 = atan2(cd21,cd11);
      dVar6 = atan2(-cd12,cd22);
      dVar7 = local_d8;
      if (dVar6 <= local_d8) {
        dVar7 = dVar6;
      }
      if (local_d8 <= dVar6) {
        local_d8 = dVar6;
      }
      uVar5 = -(ulong)(1.5707963267948966 < local_d8 - dVar7);
      dVar7 = (double)(~uVar5 & (ulong)dVar7 | (ulong)(dVar7 + 3.141592653589793) & uVar5);
      if (0.0002 < ABS(dVar7 - local_d8)) {
        *status = 0x1fa;
      }
      local_d8 = (local_d8 + dVar7) * 0.5;
      local_d0 = cd11;
      dVar7 = cos(local_d8);
      pdVar9 = local_e0;
      *local_e0 = local_d0 / dVar7;
      local_d0 = cd22;
      dVar7 = cos(local_d8);
      *yinc = local_d0 / dVar7;
      *rot = (local_d8 * 180.0) / 3.141592653589793;
      if (0.0 < *yinc || *yinc == 0.0) goto LAB_001f2de9;
      *pdVar9 = -*pdVar9;
      *yinc = -*yinc;
      dVar7 = *rot + -180.0;
    }
  }
  *rot = dVar7;
LAB_001f2de9:
  tstat = 0;
  iVar1 = ffgkys(fptr,"CTYPE1",ctype,(char *)0x0,&tstat);
  if (iVar1 == 0) {
    strncpy(type,ctype + 4,4);
    type[4] = '\0';
    if ((ctype._0_4_ == 0x2d434544) || (iVar1 = bcmp(ctype + 1,"LAT",3), iVar1 == 0)) {
      *rot = 90.0 - *rot;
      *yinc = -*yinc;
      dVar7 = *local_80;
      *local_80 = *yrval;
      *yrval = dVar7;
    }
  }
  else {
    *type = '\0';
  }
  return *status;
}

Assistant:

int ffgics(fitsfile *fptr,    /* I - FITS file pointer           */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-tan') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)

       Modified in Nov 1999 to convert the CD matrix keywords back
       to the old CDELTn form, and to swap the axes if the dec-like
       axis is given first, and to assume default values if any of the
       keywords are not present.
*/
{
    int tstat = 0, cd_exists = 0, pc_exists = 0;
    char ctype[FLEN_VALUE];
    double cd11 = 0.0, cd21 = 0.0, cd22 = 0.0, cd12 = 0.0;
    double pc11 = 1.0, pc21 = 0.0, pc22 = 1.0, pc12 = 0.0;
    double pi =  3.1415926535897932;
    double phia, phib, temp;
    double toler = .0002;  /* tolerance for angles to agree (radians) */
                           /*   (= approximately 0.01 degrees) */

    if (*status > 0)
       return(*status);

    tstat = 0;
    if (ffgkyd(fptr, "CRVAL1", xrval, NULL, &tstat))
       *xrval = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRVAL2", yrval, NULL, &tstat))
       *yrval = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRPIX1", xrpix, NULL, &tstat))
        *xrpix = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRPIX2", yrpix, NULL, &tstat))
        *yrpix = 0.;

    /* look for CDELTn first, then CDi_j keywords */
    tstat = 0;
    if (ffgkyd(fptr, "CDELT1", xinc, NULL, &tstat))
    {
        /* CASE 1: no CDELTn keyword, so look for the CD matrix */
        tstat = 0;
        if (ffgkyd(fptr, "CD1_1", &cd11, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD2_1", &cd21, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD1_2", &cd12, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD2_2", &cd22, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (cd_exists)  /* convert CDi_j back to CDELTn */
        {
            /* there are 2 ways to compute the angle: */
            phia = atan2( cd21, cd11);
            phib = atan2(-cd12, cd22);

            /* ensure that phia <= phib */
            temp = minvalue(phia, phib);
            phib = maxvalue(phia, phib);
            phia = temp;

            /* there is a possible 180 degree ambiguity in the angles */
            /* so add 180 degress to the smaller value if the values  */
            /* differ by more than 90 degrees = pi/2 radians.         */
            /* (Later, we may decide to take the other solution by    */
            /* subtracting 180 degrees from the larger value).        */

            if ((phib - phia) > (pi / 2.))
               phia += pi;

            if (fabs(phia - phib) > toler) 
            {
               /* angles don't agree, so looks like there is some skewness */
               /* between the axes.  Return with an error to be safe. */
               *status = APPROX_WCS_KEY;
            }
      
            phia = (phia + phib) /2.;  /* use the average of the 2 values */
            *xinc = cd11 / cos(phia);
            *yinc = cd22 / cos(phia);
            *rot = phia * 180. / pi;

            /* common usage is to have a positive yinc value.  If it is */
            /* negative, then subtract 180 degrees from rot and negate  */
            /* both xinc and yinc.  */

            if (*yinc < 0)
            {
                *xinc = -(*xinc);
                *yinc = -(*yinc);
                *rot = *rot - 180.;
            }
        }
        else   /* no CD matrix keywords either */
        {
            *xinc = 1.;

            /* there was no CDELT1 keyword, but check for CDELT2 just in case */
            tstat = 0;
            if (ffgkyd(fptr, "CDELT2", yinc, NULL, &tstat))
                *yinc = 1.;

            tstat = 0;
            if (ffgkyd(fptr, "CROTA2", rot, NULL, &tstat))
                *rot=0.;
        }
    }
    else  /* Case 2: CDELTn + optional PC matrix */
    {
        if (ffgkyd(fptr, "CDELT2", yinc, NULL, &tstat))
            *yinc = 1.;

        tstat = 0;
        if (ffgkyd(fptr, "CROTA2", rot, NULL, &tstat))
        {
            *rot=0.;

            /* no CROTA2 keyword, so look for the PC matrix */
            tstat = 0;
            if (ffgkyd(fptr, "PC1_1", &pc11, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC2_1", &pc21, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC1_2", &pc12, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC2_2", &pc22, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (pc_exists)  /* convert PCi_j back to CDELTn */
            {
                /* there are 2 ways to compute the angle: */
                phia = atan2( pc21, pc11);
                phib = atan2(-pc12, pc22);

                /* ensure that phia <= phib */
                temp = minvalue(phia, phib);
                phib = maxvalue(phia, phib);
                phia = temp;

                /* there is a possible 180 degree ambiguity in the angles */
                /* so add 180 degress to the smaller value if the values  */
                /* differ by more than 90 degrees = pi/2 radians.         */
                /* (Later, we may decide to take the other solution by    */
                /* subtracting 180 degrees from the larger value).        */

                if ((phib - phia) > (pi / 2.))
                   phia += pi;

                if (fabs(phia - phib) > toler) 
                {
                  /* angles don't agree, so looks like there is some skewness */
                  /* between the axes.  Return with an error to be safe. */
                  *status = APPROX_WCS_KEY;
                }
      
                phia = (phia + phib) /2.;  /* use the average of the 2 values */
                *rot = phia * 180. / pi;
            }
        }
    }

    /* get the type of projection, if any */
    tstat = 0;
    if (ffgkys(fptr, "CTYPE1", ctype, NULL, &tstat))
         type[0] = '\0';
    else
    {
        /* copy the projection type string */
        strncpy(type, &ctype[4], 4);
        type[4] = '\0';

        /* check if RA and DEC are inverted */
        if (!strncmp(ctype, "DEC-", 4) || !strncmp(ctype+1, "LAT", 3))
        {
            /* the latitudinal axis is given first, so swap them */

/*
 this case was removed on 12/9.  Apparently not correct.

            if ((*xinc / *yinc) < 0. )  
                *rot = -90. - (*rot);
            else
*/
            *rot = 90. - (*rot);

            /* Empirical tests with ds9 show the y-axis sign must be negated */
            /* and the xinc and yinc values must NOT be swapped. */
            *yinc = -(*yinc);

            temp = *xrval;
            *xrval = *yrval;
            *yrval = temp;
        }   
    }

    return(*status);
}